

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O3

void lsvm::hashmap::free(void *__ptr)

{
  ushort uVar1;
  undefined8 *puVar2;
  undefined8 *ptr;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = *(ushort *)((long)__ptr + 0x16);
  uVar3 = 0;
  do {
    ptr = *(undefined8 **)((long)__ptr + uVar3 * 8 + 0x20);
    while (ptr != (undefined8 *)0x0) {
      puVar2 = (undefined8 *)*ptr;
      memory::retain(ptr);
      ptr = puVar2;
    }
    bVar4 = uVar3 != uVar1;
    uVar3 = uVar3 + 1;
  } while (bVar4);
  memory::retain(__ptr);
  return;
}

Assistant:

void free(hashmap* h){
    // calculate current max partitions
    uint32_t max_partitions = partition_count(h->bits);

    // free all buckets
    uint32_t i = 0;
    hashbucket** bp = buckets(h);
    while(i < max_partitions){
        free_bucket(bp[i]);    
        ++i;
    }

    // free hashmap
    lsvm::memory::retain(h);
}